

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::PixelFilter::readFrom(PixelFilter *this,BinaryReader *binary)

{
  ulong uVar1;
  Type TVar2;
  size_t sVar3;
  pointer puVar4;
  size_t sVar5;
  runtime_error *this_00;
  ulong uVar6;
  
  sVar3 = binary->currentEntityOffset;
  uVar1 = sVar3 + 4;
  puVar4 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(binary->currentEntityData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar6 < uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    TVar2 = *(Type *)(puVar4 + sVar3);
    binary->currentEntityOffset = uVar1;
    this->type = TVar2;
    if (uVar6 < sVar3 + 8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      this->radius = *(float *)(puVar4 + uVar1);
      sVar5 = binary->currentEntityOffset;
      sVar3 = sVar5 + 4;
      binary->currentEntityOffset = sVar3;
      puVar4 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (sVar5 + 8 <=
          (ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4)) {
        this->alpha = *(float *)(puVar4 + sVar3);
        binary->currentEntityOffset = binary->currentEntityOffset + 4;
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void copyBytes(T *t, size_t numBytes)
    {
      if ((currentEntityOffset + numBytes) > currentEntityData.size())
        throw std::runtime_error("invalid read attempt by entity - not enough data in data block!");
      memcpy((void *)t,(void *)((char*)currentEntityData.data()+currentEntityOffset),numBytes);
      currentEntityOffset += numBytes;
    }